

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O2

bool re2::ParseInteger(StringPiece *s,int *np)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = s->length_;
  if (iVar2 != 0) {
    pbVar1 = (byte *)s->ptr_;
    if ((*pbVar1 - 0x30 < 10) && ((*pbVar1 != 0x30 || iVar2 < 2 || (9 < pbVar1[1] - 0x30)))) {
      iVar3 = 0;
      while( true ) {
        if ((iVar2 < 1) || (9 < *pbVar1 - 0x30)) {
          *np = iVar3;
          return true;
        }
        if (99999999 < iVar3) break;
        iVar3 = iVar3 * 10 + (uint)*pbVar1 + -0x30;
        s->ptr_ = (char *)(pbVar1 + 1);
        iVar2 = iVar2 + -1;
        s->length_ = iVar2;
        pbVar1 = pbVar1 + 1;
      }
    }
  }
  return false;
}

Assistant:

int size() const { return length_; }